

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall
obs::safe_list<obs::slot<void_(int,_int,_double)>_>::push_back
          (safe_list<obs::slot<void_(int,_int,_double)>_> *this,slot<void_(int,_int,_double)> *value
          )

{
  node *this_00;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  node *n;
  slot<void_(int,_int,_double)> *value_local;
  safe_list<obs::slot<void_(int,_int,_double)>_> *this_local;
  
  this_00 = (node *)operator_new(0x28);
  node::node(this_00,value);
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->m_mutex_nodes);
  if (this->m_first == (node *)0x0) {
    this->m_last = this_00;
    this->m_first = this_00;
  }
  else {
    this->m_last->next = this_00;
    this->m_last = this_00;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  return;
}

Assistant:

void push_back(T* value) {
    node* n = new node(value);

    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!m_first)
      m_first = m_last = n;
    else {
      m_last->next = n;
      m_last = n;
    }
  }